

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int aec_decode_init(aec_stream_conflict *strm)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  internal_state_conflict *__s;
  code *pcVar4;
  _func_int_aec_stream_ptr_conflict **pp_Var5;
  uint32_t *puVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  
  uVar3 = strm->bits_per_sample;
  iVar8 = -1;
  if (0xffffffdf < uVar3 - 0x21) {
    __s = (internal_state_conflict *)malloc(0x358);
    if (__s != (internal_state_conflict *)0x0) {
      iVar12 = 0;
      memset(__s,0,0x358);
      iVar8 = 1;
      iVar9 = 0;
      do {
        lVar11 = 0;
        do {
          __s->se_table[(long)iVar12 * 2 + lVar11 * 2] = iVar9;
          __s->se_table[(long)iVar12 * 2 + lVar11 * 2 + 1] = iVar12;
          lVar11 = lVar11 + 1;
        } while (iVar8 != (int)lVar11);
        iVar12 = iVar12 + iVar8;
        iVar9 = iVar9 + 1;
        iVar8 = iVar8 + 1;
      } while (iVar9 != 0xd);
      strm->state = __s;
      if (uVar3 < 0x11) {
        if (uVar3 < 9) {
          if ((strm->flags & 0x10) == 0) {
            __s->id_len = 3;
          }
          else {
            if (4 < uVar3) {
              return -1;
            }
            if (uVar3 < 3) {
              __s->id_len = 1;
            }
            else {
              __s->id_len = 2;
            }
          }
          __s->bytes_per_sample = 1;
          __s->out_blklen = strm->block_size;
          pcVar4 = flush_8;
        }
        else {
          __s->bytes_per_sample = 2;
          __s->id_len = 4;
          __s->out_blklen = strm->block_size * 2;
          if ((strm->flags & 4) == 0) {
            pcVar4 = flush_lsb_16;
          }
          else {
            pcVar4 = flush_msb_16;
          }
        }
        __s->flush_output = pcVar4;
      }
      else {
        __s->id_len = 5;
        if ((uVar3 < 0x19) && (uVar1 = strm->flags, (uVar1 & 2) != 0)) {
          __s->bytes_per_sample = 3;
          if ((uVar1 & 4) == 0) {
            pcVar4 = flush_lsb_24;
          }
          else {
            pcVar4 = flush_msb_24;
          }
        }
        else {
          __s->bytes_per_sample = 4;
          if ((strm->flags & 4) == 0) {
            pcVar4 = flush_lsb_32;
          }
          else {
            pcVar4 = flush_msb_32;
          }
        }
        __s->flush_output = pcVar4;
        __s->out_blklen = __s->bytes_per_sample * strm->block_size;
      }
      uVar1 = strm->flags;
      if ((uVar1 & 1) == 0) {
        __s->xmin = 0;
        __s->xmax = 0xffffffff >> (-(char)uVar3 & 0x1fU);
      }
      else {
        uVar2 = 0xffffffff >> (0x21U - (char)uVar3 & 0x1f);
        __s->xmax = uVar2;
        __s->xmin = ~uVar2;
      }
      uVar2 = strm->block_size;
      __s->in_blklen = (__s->id_len + uVar3 * uVar2 >> 3) + 9;
      bVar7 = (byte)__s->id_len;
      pp_Var5 = (_func_int_aec_stream_ptr_conflict **)
                malloc((0x100000000 << (bVar7 & 0x3f)) >> 0x1d);
      __s->id_table = pp_Var5;
      if (pp_Var5 != (_func_int_aec_stream_ptr_conflict **)0x0) {
        uVar10 = 1;
        *pp_Var5 = m_low_entropy;
        iVar8 = (int)(1L << (bVar7 & 0x3f));
        uVar3 = iVar8 - 1;
        if (2 < iVar8) {
          do {
            __s->id_table[uVar10] = m_split;
            uVar10 = uVar10 + 1;
          } while (uVar3 != uVar10);
        }
        __s->id_table[(int)uVar3] = m_uncomp;
        uVar10 = (ulong)(uVar2 * strm->rsi);
        __s->rsi_size = uVar10;
        puVar6 = (uint32_t *)malloc(uVar10 << 2);
        __s->rsi_buffer = puVar6;
        if (puVar6 == (uint32_t *)0x0) {
          return -4;
        }
        __s->ref = 0;
        strm->total_in = 0;
        strm->total_out = 0;
        __s->rsip = puVar6;
        __s->flush_start = puVar6;
        __s->bitp = 0;
        __s->fs = 0;
        __s->pp = uVar1 & 8;
        __s->mode = m_id;
        return 0;
      }
    }
    iVar8 = -4;
  }
  return iVar8;
}

Assistant:

int aec_decode_init(struct aec_stream *strm)
{
    int i, modi;
    struct internal_state *state;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;
    memset(state, 0, sizeof(struct internal_state));

    create_se_table(state->se_table);

    strm->state = state;

    if (strm->bits_per_sample > 16) {
        state->id_len = 5;

        if (strm->bits_per_sample <= 24 && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_24;
            else
                state->flush_output = flush_lsb_24;
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_32;
            else
                state->flush_output = flush_lsb_32;
        }
        state->out_blklen = strm->block_size
            * state->bytes_per_sample;
    }
    else if (strm->bits_per_sample > 8) {
        state->bytes_per_sample = 2;
        state->id_len = 4;
        state->out_blklen = strm->block_size * 2;
        if (strm->flags & AEC_DATA_MSB)
            state->flush_output = flush_msb_16;
        else
            state->flush_output = flush_lsb_16;
    } else {
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }

        state->bytes_per_sample = 1;
        state->out_blklen = strm->block_size;
        state->flush_output = flush_8;
    }

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample + 1);
        state->xmin = ~state->xmax;
    } else {
        state->xmin = 0;
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample);
    }

    state->in_blklen = (strm->block_size * strm->bits_per_sample
                        + state->id_len) / 8 + 9;

    modi = 1UL << state->id_len;
    state->id_table = malloc(modi * sizeof(int (*)(struct aec_stream *)));
    if (state->id_table == NULL)
        return AEC_MEM_ERROR;

    state->id_table[0] = m_low_entropy;
    for (i = 1; i < modi - 1; i++) {
        state->id_table[i] = m_split;
    }
    state->id_table[modi - 1] = m_uncomp;

    state->rsi_size = strm->rsi * strm->block_size;
    state->rsi_buffer = malloc(state->rsi_size * sizeof(uint32_t));
    if (state->rsi_buffer == NULL)
        return AEC_MEM_ERROR;

    state->ref = 0;
    strm->total_in = 0;
    strm->total_out = 0;

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->pp = strm->flags & AEC_DATA_PREPROCESS;
    state->mode = m_id;
    return AEC_OK;
}